

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v64_intrinsics_c.h
# Opt level: O3

c_v128 __thiscall simd_test_sse2::c_imm_v128_shr_n_u16<4>(simd_test_sse2 *this,c_v128 a)

{
  c_v128 cVar1;
  
  cVar1.u16[5] = a.u16[1] >> 4;
  cVar1.u16[4] = a.u16[0] >> 4;
  cVar1.u16[6] = a.u16[2] >> 4;
  cVar1.u16[7] = a.u16[3] >> 4;
  cVar1.u16[1] = (ushort)((ulong)this >> 0x10) >> 4;
  cVar1.u16[0] = (ushort)this >> 4;
  cVar1.u16[2] = (ushort)((ulong)this >> 0x20) >> 4;
  cVar1.u16[3] = (ushort)((ulong)this >> 0x34);
  return cVar1;
}

Assistant:

SIMD_INLINE c_v64 c_v64_shr_u16(c_v64 a, unsigned int n) {
  c_v64 t;
  int c;
  if (SIMD_CHECK && n > 15) {
    fprintf(stderr, "Error: Undefined u16 shift right %d\n", n);
    abort();
  }
  for (c = 0; c < 4; c++) t.u16[c] = a.u16[c] >> n;
  return t;
}